

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O2

int Abc_FlowRetime_PushFlows(Abc_Ntk_t *pNtk,int fVerbose)

{
  ushort uVar1;
  bool bVar2;
  ushort uVar3;
  MinRegMan_t *pMVar4;
  int iVar5;
  Abc_Obj_t *pAVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ushort uVar10;
  uint uVar11;
  
  pMVar4 = pManMR;
  pManMR->constraintMask = pManMR->constraintMask | 0x10;
  pMVar4->fSinkDistTerminate = 0;
  dfsfast_preorder(pNtk);
  uVar11 = 0;
  uVar10 = 0;
  while ((pManMR->fSinkDistTerminate == 0 && (uVar10 < 30000))) {
    uVar10 = 30000;
    for (iVar7 = 0; iVar5 = pNtk->vBoxes->nSize, iVar7 < iVar5; iVar7 = iVar7 + 1) {
      pAVar6 = Abc_NtkBox(pNtk,iVar7);
      if ((*(uint *)&pAVar6->field_0x14 & 0xf) == 8) {
        uVar1 = *(ushort *)&pManMR->pDataArray[(uint)pAVar6->Id].field_0x10;
        uVar3 = uVar1;
        if (uVar10 < uVar1) {
          uVar3 = uVar10;
        }
        if (uVar1 != 0) {
          uVar10 = uVar3;
        }
      }
    }
    for (iVar7 = 0; iVar7 < iVar5; iVar7 = iVar7 + 1) {
      pAVar6 = Abc_NtkBox(pNtk,iVar7);
      if (((*(uint *)&pAVar6->field_0x14 & 0xf) == 8) &&
         (uVar10 == *(ushort *)&pManMR->pDataArray[(uint)pAVar6->Id].field_0x10)) {
        iVar5 = dfsfast_e(pAVar6,(Abc_Obj_t *)0x0);
        uVar11 = (uVar11 + 1) - (uint)(iVar5 == 0);
      }
      iVar5 = pNtk->vBoxes->nSize;
    }
  }
  if ((fVerbose != 0) && (pManMR->fVerbose != 0)) {
    printf("\t\tmax-flow1 = %d \t",(ulong)uVar11);
  }
  uVar9 = (ulong)uVar11;
  do {
    for (iVar7 = 0; uVar8 = (uint)uVar9, iVar7 < pNtk->vBoxes->nSize; iVar7 = iVar7 + 1) {
      pAVar6 = Abc_NtkBox(pNtk,iVar7);
      if ((*(uint *)&pAVar6->field_0x14 & 0xf) == 8) {
        iVar5 = dfsplain_e(pAVar6,(Abc_Obj_t *)0x0);
        if (iVar5 != 0) {
          for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
            pAVar6 = Abc_NtkObj(pNtk,iVar5);
            if (pAVar6 != (Abc_Obj_t *)0x0) {
              *(ushort *)(pManMR->pDataArray + (uint)pAVar6->Id) =
                   *(ushort *)(pManMR->pDataArray + (uint)pAVar6->Id) & 0xfffc;
            }
          }
          uVar9 = (ulong)(uVar8 + 1);
        }
      }
    }
    bVar2 = (int)uVar11 < (int)uVar8;
    uVar11 = uVar8;
  } while (bVar2);
  if ((fVerbose != 0) && (pManMR->fVerbose != 0)) {
    printf("max-flow2 = %d\n",uVar9);
  }
  return uVar8;
}

Assistant:

int
Abc_FlowRetime_PushFlows( Abc_Ntk_t * pNtk, int fVerbose ) {
  int i, j, flow = 0, last, srcDist = 0;
  Abc_Obj_t   *pObj, *pObj2;
//  int clk = clock();

  pManMR->constraintMask |= BLOCK;

  pManMR->fSinkDistTerminate = 0;
  dfsfast_preorder( pNtk );

  // (i) fast max-flow computation
  while(!pManMR->fSinkDistTerminate && srcDist < MAX_DIST) {
    srcDist = MAX_DIST;
    Abc_NtkForEachLatch( pNtk, pObj, i )
      if (FDATA(pObj)->e_dist)    
        srcDist = MIN(srcDist, (int)FDATA(pObj)->e_dist);
    
    Abc_NtkForEachLatch( pNtk, pObj, i ) {
      if (srcDist == (int)FDATA(pObj)->e_dist &&
          dfsfast_e( pObj, NULL )) {
#ifdef DEBUG_PRINT_FLOWS
        printf("\n\n");
#endif
        flow++;
      }
    }
  }

  if (fVerbose) vprintf("\t\tmax-flow1 = %d \t", flow);

  // (ii) complete max-flow computation
  // also, marks source-reachable nodes
  do {
    last = flow;
    Abc_NtkForEachLatch( pNtk, pObj, i ) {
      if (dfsplain_e( pObj, NULL )) {
#ifdef DEBUG_PRINT_FLOWS
        printf("\n\n");
#endif
        flow++;
        Abc_NtkForEachObj( pNtk, pObj2, j )
          FUNSET( pObj2, VISITED );
      }
    }
  } while (flow > last);
  
  if (fVerbose) vprintf("max-flow2 = %d\n", flow);

//  PRT( "time", clock() - clk );
  return flow;
}